

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_get_rows_back(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  long local_28;
  int64_t local_20;
  
  if (((((a->ne[2] == 1) && (a->ne[3] == 1)) && (b->ne[1] == 1)) &&
      ((b->ne[2] == 1 && (b->ne[3] == 1)))) && (b->type == GGML_TYPE_I32)) {
    if (((c->ne[2] == 1) && (c->ne[3] == 1)) && (local_28 = a->ne[0], local_28 == c->ne[0])) {
      local_20 = c->ne[1];
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,2,&local_28,(ggml_tensor *)0x0,0);
      pgVar1->op = GGML_OP_GET_ROWS_BACK;
      pgVar1->src[0] = a;
      pgVar1->src[1] = b;
      return pgVar1;
    }
    pcVar2 = "ggml_is_matrix(c) && (a->ne[0] == c->ne[0])";
    line = 0xd19;
  }
  else {
    pcVar2 = "ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32";
    line = 0xd18;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_get_rows_back(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c) {
    GGML_ASSERT(ggml_is_matrix(a) && ggml_is_vector(b) && b->type == GGML_TYPE_I32);
    GGML_ASSERT(ggml_is_matrix(c) && (a->ne[0] == c->ne[0]));

    // TODO: implement non F32 return
    //struct ggml_tensor * result = ggml_new_tensor_2d(ctx, a->type, a->ne[0], b->ne[0]);
    struct ggml_tensor * result = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, c->ne[0], c->ne[1]);

    result->op     = GGML_OP_GET_ROWS_BACK;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}